

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TgTypeParser.cpp
# Opt level: O0

string * __thiscall
TgBot::TgTypeParser::parseCallbackQuery_abi_cxx11_
          (string *__return_storage_ptr__,TgTypeParser *this,Ptr *object)

{
  bool bVar1;
  element_type *peVar2;
  allocator local_189;
  string local_188;
  allocator local_161;
  string local_160;
  allocator local_139;
  string local_138;
  allocator local_111;
  string local_110;
  string local_f0;
  allocator local_c9;
  string local_c8;
  string local_a8;
  allocator local_81;
  string local_80;
  allocator local_59;
  string local_58;
  undefined1 local_35;
  allocator local_21;
  __shared_ptr_access<TgBot::CallbackQuery,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_20;
  Ptr *object_local;
  TgTypeParser *this_local;
  string *result;
  
  local_20 = (__shared_ptr_access<TgBot::CallbackQuery,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             object;
  object_local = (Ptr *)this;
  this_local = (TgTypeParser *)__return_storage_ptr__;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)object);
  if (bVar1) {
    local_35 = 0;
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'{');
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_58,"id",&local_59);
    peVar2 = std::
             __shared_ptr_access<TgBot::CallbackQuery,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_20);
    appendToJson(this,__return_storage_ptr__,&local_58,&peVar2->id);
    std::__cxx11::string::~string((string *)&local_58);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_80,"from",&local_81);
    peVar2 = std::
             __shared_ptr_access<TgBot::CallbackQuery,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_20);
    parseUser_abi_cxx11_(&local_a8,this,&peVar2->from);
    appendToJson(this,__return_storage_ptr__,&local_80,&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_c8,"message",&local_c9);
    peVar2 = std::
             __shared_ptr_access<TgBot::CallbackQuery,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_20);
    parseMessage_abi_cxx11_(&local_f0,this,&peVar2->message);
    appendToJson(this,__return_storage_ptr__,&local_c8,&local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_c9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_110,"inline_message_id",&local_111);
    peVar2 = std::
             __shared_ptr_access<TgBot::CallbackQuery,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_20);
    appendToJson(this,__return_storage_ptr__,&local_110,&peVar2->inlineMessageId);
    std::__cxx11::string::~string((string *)&local_110);
    std::allocator<char>::~allocator((allocator<char> *)&local_111);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_138,"chat_instance",&local_139);
    peVar2 = std::
             __shared_ptr_access<TgBot::CallbackQuery,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_20);
    appendToJson(this,__return_storage_ptr__,&local_138,&peVar2->chatInstance);
    std::__cxx11::string::~string((string *)&local_138);
    std::allocator<char>::~allocator((allocator<char> *)&local_139);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_160,"game_short_name",&local_161);
    peVar2 = std::
             __shared_ptr_access<TgBot::CallbackQuery,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_20);
    appendToJson(this,__return_storage_ptr__,&local_160,&peVar2->gameShortName);
    std::__cxx11::string::~string((string *)&local_160);
    std::allocator<char>::~allocator((allocator<char> *)&local_161);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_188,"data",&local_189);
    peVar2 = std::
             __shared_ptr_access<TgBot::CallbackQuery,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_20);
    appendToJson(this,__return_storage_ptr__,&local_188,&peVar2->data);
    std::__cxx11::string::~string((string *)&local_188);
    std::allocator<char>::~allocator((allocator<char> *)&local_189);
    removeLastComma(this,__return_storage_ptr__);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'}');
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_21);
    std::allocator<char>::~allocator((allocator<char> *)&local_21);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string TgTypeParser::parseCallbackQuery(const CallbackQuery::Ptr& object) const {
    if (!object){
        return "";
    }

    string result;
    result += '{';
    appendToJson(result, "id", object->id);
    appendToJson(result, "from", parseUser(object->from));
    appendToJson(result, "message", parseMessage(object->message));
    appendToJson(result, "inline_message_id", object->inlineMessageId);
    appendToJson(result, "chat_instance", object->chatInstance);
    appendToJson(result, "game_short_name", object->gameShortName);
    appendToJson(result, "data", object->data);
    removeLastComma(result);
    result += '}';
    return result;
}